

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_api_v2.c
# Opt level: O1

MPP_RET h264e_init(void *ctx,EncImplCfg *ctrl_cfg)

{
  H264eReorderInfo *reorder;
  H264eMarkingInfo *marking;
  int iVar1;
  long lVar2;
  void *pvVar3;
  long lVar4;
  undefined4 uVar5;
  long lVar6;
  long lVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  
  mpp_env_get_u32("h264e_debug",&h264e_debug,0);
  if (((byte)h264e_debug & 1) != 0) {
    _mpp_log_l(4,"h264e_api_v2","enter\n","h264e_init");
  }
  *(MppClientType *)ctx = ctrl_cfg->type;
  *(undefined8 *)((long)ctx + 0x1878) = 0x400;
  pvVar3 = mpp_osal_malloc("h264e_init",0x400);
  *(void **)((long)ctx + 0x1870) = pvVar3;
  if (pvVar3 == (void *)0x0) {
    _mpp_log_l(2,"h264e_api_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"p->hdr_buf",
               "h264e_init",0xe0);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00236d67;
  }
  mpp_packet_init((MppPacket *)((long)ctx + 0x1868),*(void **)((long)ctx + 0x1870),
                  *(size_t *)((long)ctx + 0x1878));
  if (*(long *)((long)ctx + 0x1868) == 0) {
    _mpp_log_l(2,"h264e_api_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"p->hdr_pkt",
               "h264e_init",0xe2);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00236d67:
      abort();
    }
  }
  *(MppEncCfgSet **)((long)ctx + 8) = ctrl_cfg->cfg;
  *(MppEncRefs *)((long)ctx + 0x10) = ctrl_cfg->refs;
  *(undefined4 *)((long)ctx + 0x18) = 0;
  reorder = (H264eReorderInfo *)((long)ctx + 0x1650);
  h264e_reorder_init(reorder);
  marking = (H264eMarkingInfo *)((long)ctx + 0x175c);
  h264e_marking_init(marking);
  h264e_dpb_init((H264eDpb *)((long)ctx + 0x1a0),reorder,marking);
  h264e_slice_init((H264eSlice *)((long)ctx + 0x15c0),reorder,marking);
  lVar2 = *(long *)((long)ctx + 8);
  iVar1 = *ctx;
  memset((void *)(lVar2 + 0x348),0,0x90);
  *(undefined8 *)(lVar2 + 0x36c) = 0x1f00000042;
  *(undefined8 *)(lVar2 + 0x1864) = 0;
  *(undefined4 *)(lVar2 + 0x1894) = 0;
  lVar4 = 0x358;
  uVar5 = 0xc;
  lVar6 = 0x354;
  uVar8 = 2;
  lVar7 = 0x350;
  if (iVar1 - 0x11U < 2) {
    uVar9 = 2;
  }
  else if (iVar1 == 0x10) {
    *(undefined8 *)(lVar2 + 0x350) = 0xc00000000;
    uVar9 = 0;
    lVar4 = 0x398;
    uVar5 = 0xfffffffa;
    lVar6 = 0x394;
    uVar8 = 0xc;
    lVar7 = 0x358;
  }
  else {
    uVar8 = 0;
    uVar9 = 0;
  }
  *(undefined4 *)(lVar2 + lVar7) = uVar8;
  *(undefined4 *)(lVar2 + lVar6) = uVar5;
  *(undefined4 *)(lVar2 + lVar4) = uVar5;
  *(undefined4 *)(lVar2 + 0x360) = uVar9;
  *(undefined8 *)(lVar2 + 0x364) = 0xc;
  *(undefined8 *)(lVar2 + 8) = 0x50000000000;
  *(undefined8 *)(lVar2 + 0x10) = 0x500000002d0;
  *(undefined4 *)(lVar2 + 0x18) = 0x2d0;
  *(undefined4 *)(lVar2 + 0x24) = 0;
  *(undefined8 *)(lVar2 + 0x50) = 0;
  *(undefined8 *)(lVar2 + 0x28) = 0x200000002;
  *(undefined8 *)(lVar2 + 0x30) = 2;
  *(undefined4 *)(lVar2 + 0x90) = 0;
  *(undefined8 *)(lVar2 + 0x58) = 0;
  *(undefined8 *)(lVar2 + 0x60) = 0;
  *(undefined8 *)(lVar2 + 0x98) = 0x1e848000000002;
  *(undefined8 *)(lVar2 + 0xa0) = 0x16e360002625a0;
  *(undefined8 *)(lVar2 + 0xa8) = 0x1e00000000;
  *(undefined8 *)(lVar2 + 0xb0) = 1;
  *(undefined8 *)(lVar2 + 0xb8) = 0x10000001e;
  *(undefined4 *)(lVar2 + 0xc4) = 0x3c;
  *(undefined4 *)(lVar2 + 0xd4) = 1;
  *(undefined8 *)(lVar2 + 0x100) = 0xa0000001e;
  *(undefined8 *)(lVar2 + 0x108) = 0x1a000000a0;
  *(undefined8 *)(lVar2 + 0x110) = 0x30;
  *(undefined8 *)(lVar2 + 0x118) = 8;
  *(undefined4 *)(lVar2 + 0x124) = 2;
  *(undefined8 *)(lVar2 + 300) = 0x7fffffff7fffffff;
  *(undefined8 *)(lVar2 + 0x134) = 0x7fffffff7fffffff;
  *(undefined8 *)(lVar2 + 0x1874) = 0x600000006;
  *(undefined4 *)(lVar2 + 0x1884) = 1;
  *(undefined8 *)(lVar2 + 0x187c) = 0x100000001;
  *(undefined8 *)(lVar2 + 0x186c) = 0x100000003;
  mpp_env_get_u32("h264e_debug",&h264e_debug,0);
  if (((byte)h264e_debug & 1) != 0) {
    _mpp_log_l(4,"h264e_api_v2","leave\n","h264e_init");
  }
  return MPP_OK;
}

Assistant:

static MPP_RET h264e_init(void *ctx, EncImplCfg *ctrl_cfg)
{
    MPP_RET ret = MPP_OK;
    H264eCtx *p = (H264eCtx *)ctx;

    mpp_env_get_u32("h264e_debug", &h264e_debug, 0);

    h264e_dbg_func("enter\n");

    p->type = ctrl_cfg->type;
    p->hdr_size = SZ_1K;
    p->hdr_buf = mpp_malloc_size(void, p->hdr_size);
    mpp_assert(p->hdr_buf);
    mpp_packet_init(&p->hdr_pkt, p->hdr_buf, p->hdr_size);
    mpp_assert(p->hdr_pkt);

    p->cfg = ctrl_cfg->cfg;
    p->refs = ctrl_cfg->refs;
    p->idr_request = 0;

    h264e_reorder_init(&p->reorder);
    h264e_marking_init(&p->marking);

    h264e_dpb_init(&p->dpb, &p->reorder, &p->marking);
    h264e_slice_init(&p->slice, &p->reorder, &p->marking);

    init_h264e_cfg_set(p->cfg, p->type);

    mpp_env_get_u32("h264e_debug", &h264e_debug, 0);

    h264e_dbg_func("leave\n");
    return ret;
}